

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O1

void array_negation_empty_test(void)

{
  array_container_t *src;
  bitset_container_t *dst;
  
  src = array_container_create();
  dst = bitset_container_create();
  array_container_negation(src,dst);
  _assert_int_equal((long)dst->cardinality,0x10000,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x55a);
  array_container_free(src);
  bitset_container_free(dst);
  return;
}

Assistant:

DEFINE_TEST(array_negation_empty_test) {
    array_container_t* AI = array_container_create();
    bitset_container_t* BO = bitset_container_create();

    array_container_negation(AI, BO);

    assert_int_equal(bitset_container_cardinality(BO), (1 << 16));

    array_container_free(AI);
    bitset_container_free(BO);
}